

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup_p.h
# Opt level: O0

void __thiscall QDnsLookupPrivate::QDnsLookupPrivate(QDnsLookupPrivate *this)

{
  long lVar1;
  QDnsLookupReply *in_RDI;
  long in_FS_OFFSET;
  Type *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QObjectPrivate::QObjectPrivate((QObjectPrivate *)in_RDI,QObjectPrivateVersion);
  *(undefined ***)in_RDI = &PTR__QDnsLookupPrivate_0049f800;
  QObjectBindableProperty<QDnsLookupPrivate,_QString,_&QDnsLookupPrivate::_qt_property_name_offset,_&QDnsLookupPrivate::nameChanged>
  ::QObjectBindableProperty
            ((QObjectBindableProperty<QDnsLookupPrivate,_QString,_&QDnsLookupPrivate::_qt_property_name_offset,_&QDnsLookupPrivate::nameChanged>
              *)0x343427);
  QObjectBindableProperty<QDnsLookupPrivate,_QHostAddress,_&QDnsLookupPrivate::_qt_property_nameserver_offset,_&QDnsLookupPrivate::nameserverChanged>
  ::QObjectBindableProperty
            ((QObjectBindableProperty<QDnsLookupPrivate,_QHostAddress,_&QDnsLookupPrivate::_qt_property_nameserver_offset,_&QDnsLookupPrivate::nameserverChanged>
              *)0x343438);
  QObjectBindableProperty<QDnsLookupPrivate,_QDnsLookup::Type,_&QDnsLookupPrivate::_qt_property_type_offset,_&QDnsLookupPrivate::typeChanged>
  ::QObjectBindableProperty
            ((QObjectBindableProperty<QDnsLookupPrivate,_QDnsLookup::Type,_&QDnsLookupPrivate::_qt_property_type_offset,_&QDnsLookupPrivate::typeChanged>
              *)in_RDI,in_stack_ffffffffffffffd8);
  QObjectBindableProperty<QDnsLookupPrivate,_unsigned_short,_&QDnsLookupPrivate::_qt_property_port_offset,_&QDnsLookupPrivate::nameserverPortChanged>
  ::QObjectBindableProperty
            ((QObjectBindableProperty<QDnsLookupPrivate,_unsigned_short,_&QDnsLookupPrivate::_qt_property_port_offset,_&QDnsLookupPrivate::nameserverPortChanged>
              *)in_RDI,(unsigned_short *)in_stack_ffffffffffffffd8);
  QObjectBindableProperty<QDnsLookupPrivate,_QDnsLookup::Protocol,_&QDnsLookupPrivate::_qt_property_protocol_offset,_&QDnsLookupPrivate::nameserverProtocolChanged>
  ::QObjectBindableProperty
            ((QObjectBindableProperty<QDnsLookupPrivate,_QDnsLookup::Protocol,_&QDnsLookupPrivate::_qt_property_protocol_offset,_&QDnsLookupPrivate::nameserverProtocolChanged>
              *)in_RDI,(Protocol *)in_stack_ffffffffffffffd8);
  QDnsLookupReply::QDnsLookupReply(in_RDI);
  in_RDI[1].serviceRecords.d.ptr = (QDnsServiceRecord *)0x0;
  *(undefined1 *)&in_RDI[1].serviceRecords.d.size = 0;
  std::optional<QSslConfiguration>::optional((optional<QSslConfiguration> *)0x3434c2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDnsLookupPrivate()
        : type(QDnsLookup::A)
        , port(0)
        , protocol(QDnsLookup::Standard)
    { }